

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O2

void __thiscall
StringType::DoGenParseCode(StringType *this,Output *out_cc,Env *env,DataPtr *data,int flags)

{
  Expr *this_00;
  bool bVar1;
  Exception *this_01;
  char *pcVar2;
  ID *pIVar3;
  allocator<char> local_6d;
  int len;
  string str_size;
  string local_48;
  
  GenStringSize_abi_cxx11_(&str_size,this,out_cc,env,data);
  if (*(int *)&(this->super_Type).field_0x18c == 0) {
    GenCheckingCStr(this,out_cc,env,data,&str_size);
  }
  if ((this->super_Type).anonymous_value_var_ != false) goto LAB_00121a85;
  if ((*(int *)&(this->super_Type).field_0x18c == 2) &&
     (this_00 = (this->super_Type).attr_length_expr_, this_00 != (Expr *)0x0)) {
    bVar1 = Expr::ConstFold(this_00,env,&len);
    if (!bVar1) goto LAB_00121a17;
    if (len < 0) {
      this_01 = (Exception *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"negative &length on string",&local_6d);
      Exception::Exception(this_01,&(this->super_Type).super_Object,&local_48);
      __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
    }
  }
  else {
LAB_00121a17:
    Output::println(out_cc,"// check for negative sizes");
    Output::println(out_cc,"if ( %s < 0 )",str_size._M_dataplus._M_p);
    Output::println(out_cc,"throw binpac::ExceptionInvalidStringLength(\"%s\", %s);",
                    (this->super_Type).super_Object.location._M_dataplus._M_p,
                    str_size._M_dataplus._M_p);
  }
  pcVar2 = Env::LValue(env,(this->super_Type).value_var_);
  Output::println(out_cc,"%s.init(%s, %s);",pcVar2,(data->ptr_expr_)._M_dataplus._M_p,
                  str_size._M_dataplus._M_p);
LAB_00121a85:
  pIVar3 = Type::parsing_complete_var(&this->super_Type);
  if (pIVar3 != (ID *)0x0) {
    pIVar3 = Type::parsing_complete_var(&this->super_Type);
    pcVar2 = Env::LValue(env,pIVar3);
    Output::println(out_cc,"%s = true;",pcVar2);
  }
  std::__cxx11::string::~string((string *)&str_size);
  return;
}

Assistant:

void StringType::DoGenParseCode(Output* out_cc, Env* env, const DataPtr& data, int flags)
	{
	string str_size = GenStringSize(out_cc, env, data);

	// Generate additional checking
	switch ( type_ )
		{
		case CSTR:
			GenCheckingCStr(out_cc, env, data, str_size);
			break;
		case REGEX:
		case ANYSTR:
			break;
		}

	if ( ! anonymous_value_var() )
		{
		// Set the value variable

		int len;

		if ( type_ == ANYSTR && attr_length_expr_ && attr_length_expr_->ConstFold(env, &len) )
			{
			// can check for a negative length now
			if ( len < 0 )
				throw Exception(this, "negative &length on string");
			}
		else
			{
			out_cc->println("// check for negative sizes");
			out_cc->println("if ( %s < 0 )", str_size.c_str());
			out_cc->println("throw binpac::ExceptionInvalidStringLength(\"%s\", %s);", Location(),
			                str_size.c_str());
			}

		out_cc->println("%s.init(%s, %s);", env->LValue(value_var()), data.ptr_expr(),
		                str_size.c_str());
		}

	if ( parsing_complete_var() )
		{
		out_cc->println("%s = true;", env->LValue(parsing_complete_var()));
		}
	}